

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

void __thiscall
llvm::StringRef::split
          (StringRef *this,SmallVectorImpl<llvm::StringRef> *A,char Separator,int MaxSplit,
          bool KeepEmpty)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  size_t __n;
  bool bVar5;
  StringRef local_58;
  SmallVectorImpl<llvm::StringRef> *local_48;
  StringRef local_40;
  
  local_58.Data = this->Data;
  local_48 = A;
  for (__n = this->Length;
      (pcVar1 = local_58.Data, bVar5 = MaxSplit != 0, MaxSplit = MaxSplit + -1,
      local_58.Length = __n, bVar5 && (__n != 0)); __n = __n - uVar3) {
    pcVar2 = (char *)memchr(local_58.Data,(int)CONCAT71(in_register_00000011,Separator),__n);
    if ((pcVar2 == (char *)0x0) ||
       (uVar4 = (long)pcVar2 - (long)pcVar1, uVar4 == 0xffffffffffffffff)) goto LAB_001573e5;
    if (pcVar2 != pcVar1 || KeepEmpty) {
      local_40.Length = uVar4;
      if (pcVar2 == pcVar1) {
        local_40.Length = 0;
      }
      if (__n < local_40.Length) {
        local_40.Length = __n;
      }
      local_40.Data = pcVar1;
      SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                (&local_48->super_SmallVectorTemplateBase<llvm::StringRef,_true>,&local_40);
    }
    uVar3 = uVar4 + 1;
    if (__n <= uVar4) {
      uVar3 = __n;
    }
    local_58.Data = pcVar1 + uVar3;
  }
  if ((KeepEmpty) || (__n != 0)) {
LAB_001573e5:
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              (&local_48->super_SmallVectorTemplateBase<llvm::StringRef,_true>,&local_58);
  }
  return;
}

Assistant:

void StringRef::split(SmallVectorImpl<StringRef> &A, char Separator,
                      int MaxSplit, bool KeepEmpty) const {
  StringRef S = *this;

  // Count down from MaxSplit. When MaxSplit is -1, this will just split
  // "forever". This doesn't support splitting more than 2^31 times
  // intentionally; if we ever want that we can make MaxSplit a 64-bit integer
  // but that seems unlikely to be useful.
  while (MaxSplit-- != 0) {
    size_t Idx = S.find(Separator);
    if (Idx == npos)
      break;

    // Push this split.
    if (KeepEmpty || Idx > 0)
      A.push_back(S.slice(0, Idx));

    // Jump forward.
    S = S.slice(Idx + 1, npos);
  }

  // Push the tail.
  if (KeepEmpty || !S.empty())
    A.push_back(S);
}